

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

void __thiscall nuraft::buffer_serializer::put_i64(buffer_serializer *this,int64_t val)

{
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  overflow_error *this_00;
  byte bVar5;
  byte bVar9;
  byte bVar10;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  sVar1 = this->pos_;
  sVar3 = buffer::size(this->buf_);
  if (sVar1 + 8 <= sVar3) {
    pbVar4 = buffer::data_begin(this->buf_);
    sVar1 = this->pos_;
    bVar10 = (byte)((ulong)val >> 8);
    bVar5 = (byte)((ulong)val >> 0x18);
    bVar6 = (byte)((ulong)val >> 0x20);
    bVar7 = (byte)((ulong)val >> 0x28);
    bVar8 = (byte)((ulong)val >> 0x30);
    bVar9 = (byte)((ulong)val >> 0x38);
    bVar2 = (byte)((ulong)val >> 0x10);
    if (this->endian_ == LITTLE) {
      pbVar4[sVar1] = (byte)val;
      pbVar4[sVar1 + 1] = bVar10;
      pbVar4[sVar1 + 2] = bVar2;
      pbVar4[sVar1 + 3] = bVar5;
      pbVar4[sVar1 + 4] = bVar6;
      pbVar4[sVar1 + 5] = bVar7;
      pbVar4[sVar1 + 6] = bVar8;
      pbVar4[sVar1 + 7] = bVar9;
    }
    else {
      pbVar4[sVar1 + 7] = (byte)val;
      pbVar4[sVar1 + 6] = bVar10;
      pbVar4[sVar1 + 5] = bVar2;
      pbVar4[sVar1 + 4] = bVar5;
      pbVar4[sVar1 + 3] = bVar6;
      pbVar4[sVar1 + 2] = bVar7;
      pbVar4[sVar1 + 1] = bVar8;
      pbVar4[sVar1] = bVar9;
    }
    pos(this,this->pos_ + 8);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_i64(int64_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put64l(val, ptr); }
    else                    { put64b(val, ptr); }
    pos( pos() + sizeof(val) );
}